

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O1

LocaleDisplayNames *
icu_63::LocaleDisplayNames::createInstance(Locale *locale,UDialectHandling dialectHandling)

{
  LocaleDisplayNamesImpl *this;
  undefined4 in_register_00000034;
  
  this = (LocaleDisplayNamesImpl *)
         UMemory::operator_new((UMemory *)0x4b8,CONCAT44(in_register_00000034,dialectHandling));
  if (this == (LocaleDisplayNamesImpl *)0x0) {
    this = (LocaleDisplayNamesImpl *)0x0;
  }
  else {
    LocaleDisplayNamesImpl::LocaleDisplayNamesImpl(this,locale,dialectHandling);
  }
  return &this->super_LocaleDisplayNames;
}

Assistant:

LocaleDisplayNames*
LocaleDisplayNames::createInstance(const Locale& locale,
                                   UDialectHandling dialectHandling) {
    return new LocaleDisplayNamesImpl(locale, dialectHandling);
}